

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stock.cpp
# Opt level: O1

void __thiscall L10_2::Stock::acquire(Stock *this,string *co,long n,double pr)

{
  ostream *poVar1;
  
  std::__cxx11::string::_M_assign((string *)this);
  if (n < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of shares can\'t be negative; ",0x24);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->company)._M_dataplus._M_p,
                        (this->company)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," shares set to 0.\n",0x12);
    n = 0;
  }
  this->shares = n;
  this->share_val = pr;
  this->total_val = (double)n * pr;
  return;
}

Assistant:

void L10_2::Stock::acquire(const std::string &co, long n, double pr) {
    company = co;
    if (n < 0) {
        std::cout << "Number of shares can't be negative; " << company << " shares set to 0.\n";
        shares= 0 ;
    } else {
        shares = n;
    }
    share_val = pr;
    //  设置 total 值
    set_tot();
}